

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

_Bool duckdb_je_tsd_tcache_data_init
                (tsd_t *tsd,arena_t *arena,cache_bin_info_t *duckdb_je_tcache_bin_info)

{
  long *plVar1;
  rtree_ctx_t *rtree_ctx;
  tcache_slow_t *tsd_00;
  tcache_t *tcache_00;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  long lVar5;
  undefined8 uVar6;
  _Bool _Var7;
  uint uVar8;
  arena_t *paVar9;
  ulong uVar10;
  rtree_leaf_elm_t *prVar11;
  arena_t *extraout_RAX;
  atomic_p_t arena_00;
  arena_t *key;
  arena_t *extraout_RAX_00;
  long lVar12;
  ulong uVar13;
  tcache_t *tcache_01;
  tcache_t *tcache;
  ulong uVar14;
  rtree_ctx_t *in_R8;
  arena_t *tcache_02;
  tcache_slow_t *tcache_slow;
  ulong *puVar15;
  size_t usize;
  size_t alignment;
  size_t size;
  ulong local_40;
  size_t local_38;
  
  duckdb_je_cache_bin_info_compute_alloc
            (duckdb_je_tcache_bin_info,
             (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).tcache_nbins,
             &local_38,&local_40);
  _Var7 = duckdb_je_cache_bin_stack_use_thp();
  if (_Var7) {
    paVar9 = (arena_t *)duckdb_je_b0_alloc_tcache_stack((tsdn_t *)tsd,local_38);
    tcache_02 = paVar9;
  }
  else {
    if (local_40 < 0x1001 && local_38 < 0x3801) {
      uVar10 = -local_40 & (local_38 + local_40) - 1;
      if (uVar10 < 0x1001) {
        usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar10 + 7 >> 3]];
      }
      else {
        if (0x7000000000000000 < uVar10) goto LAB_01183c4d;
        uVar13 = uVar10 * 2 - 1;
        lVar12 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        uVar13 = -1L << (0x3c - ((byte)lVar12 ^ 0x3f) & 0x3f);
        usize = ~uVar13 + uVar10 & uVar13;
      }
      uVar10 = 0x4000;
      if (0x3fff < usize) goto LAB_01183c52;
    }
    else if (local_40 < 0x7000000000000001) {
      uVar10 = 0x4000;
      if (0x4000 < local_38) {
        if (local_38 < 0x7000000000000001) {
          uVar10 = local_38 * 2 - 1;
          lVar12 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> lVar12 == 0; lVar12 = lVar12 + -1) {
            }
          }
          uVar10 = -1L << (0x3c - ((byte)lVar12 ^ 0x3f) & 0x3f);
          uVar10 = ~uVar10 + local_38 & uVar10;
        }
        else {
          uVar10 = 0;
        }
        if (uVar10 < local_38) goto LAB_01183c4d;
      }
LAB_01183c52:
      usize = 0;
      if (uVar10 <= (duckdb_je_sz_large_pad + (local_40 + 0xfff & 0x7ffffffffffff000) + uVar10) -
                    0x1000) {
        usize = uVar10;
      }
    }
    else {
LAB_01183c4d:
      usize = 0;
    }
    arena_00 = duckdb_je_arenas[0];
    local_38 = usize;
    if (duckdb_je_arenas[0].repr == (void *)0x0) {
      arena_00.repr = duckdb_je_arena_init((tsdn_t *)0x0,0,&duckdb_je_arena_config_default);
    }
    in_R8 = (rtree_ctx_t *)&DAT_00000001;
    key = (arena_t *)
          duckdb_je_arena_palloc
                    ((tsdn_t *)tsd,(arena_t *)arena_00.repr,usize,local_40,true,usize < 0x3801,
                     (tcache_t *)0x0);
    if (key == (arena_t *)0x0) goto LAB_01183dda;
    rtree_ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    uVar14 = (ulong)key & 0xffffffffc0000000;
    uVar8 = ((uint)((ulong)key >> 0x1e) & 0xf) << 4;
    puVar15 = (ulong *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
                               ).cache[0].leafkey + (ulong)uVar8);
    uVar10 = *puVar15;
    uVar13 = uVar14;
    if (uVar10 == uVar14) {
      prVar11 = (rtree_leaf_elm_t *)
                ((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) +
                *(long *)((long)&(tsd->
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                 cache[0].leaf + (ulong)uVar8));
    }
    else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
             leafkey == uVar14) {
      prVar11 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
                leaf;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
           uVar10;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
           *(rtree_leaf_elm_t **)
            ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].
                    leaf + (ulong)uVar8);
      *puVar15 = uVar14;
      *(rtree_leaf_elm_t **)
       ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].leaf
       + (ulong)uVar8) = prVar11;
      prVar11 = (rtree_leaf_elm_t *)
                ((long)&(prVar11->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
    }
    else {
      lVar12 = 0x2d0;
      do {
        if (*(ulong *)((long)tsd + lVar12 + -8) == uVar14) {
          lVar5 = *(long *)(&tsd->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
                           lVar12);
          puVar2 = (undefined8 *)((long)tsd + lVar12 + -0x18);
          uVar6 = puVar2[1];
          puVar3 = (undefined8 *)((long)tsd + lVar12 + -8);
          *puVar3 = *puVar2;
          puVar3[1] = uVar6;
          *(ulong *)((long)tsd + lVar12 + -0x18) = uVar10;
          *(undefined8 *)((long)tsd + lVar12 + -0x10) =
               *(undefined8 *)
                ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                        [0].leaf + (ulong)uVar8);
          *puVar15 = uVar14;
          *(long *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                           cache[0].leaf + (ulong)uVar8) = lVar5;
          prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + lVar5);
          in_R8 = rtree_ctx;
          goto LAB_01183d20;
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x340);
      in_R8 = (rtree_ctx_t *)&DAT_00000001;
      prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,(uintptr_t)key
                           ,true,false);
      uVar13 = *puVar15;
    }
LAB_01183d20:
    pvVar4 = duckdb_je_arenas
             [*(uint *)(((long)(prVar11->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
              0xfff].repr;
    if (uVar13 == uVar14) {
      prVar11 = (rtree_leaf_elm_t *)
                ((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) +
                *(long *)((long)&(tsd->
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                 cache[0].leaf + (ulong)uVar8));
    }
    else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
             leafkey == uVar14) {
      prVar11 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
                leaf;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
           uVar13;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
           *(rtree_leaf_elm_t **)
            ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].
                    leaf + (ulong)uVar8);
LAB_01183e8e:
      *puVar15 = uVar14;
      *(rtree_leaf_elm_t **)
       ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].leaf
       + (ulong)uVar8) = prVar11;
      prVar11 = (rtree_leaf_elm_t *)
                ((long)&(prVar11->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
    }
    else {
      lVar12 = 0x2d0;
      do {
        if (*(ulong *)((long)tsd + lVar12 + -8) == uVar14) {
          prVar11 = *(rtree_leaf_elm_t **)
                     (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
                     lVar12);
          puVar2 = (undefined8 *)((long)tsd + lVar12 + -0x18);
          uVar6 = puVar2[1];
          puVar3 = (undefined8 *)((long)tsd + lVar12 + -8);
          *puVar3 = *puVar2;
          puVar3[1] = uVar6;
          *(ulong *)((long)tsd + lVar12 + -0x18) = uVar13;
          *(undefined8 *)((long)tsd + lVar12 + -0x10) =
               *(undefined8 *)
                ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                        [0].leaf + (ulong)uVar8);
          goto LAB_01183e8e;
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x340);
      in_R8 = (rtree_ctx_t *)&DAT_00000001;
      prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,(uintptr_t)key
                           ,true,false);
    }
    paVar9 = (arena_t *)duckdb_je_sz_index2size_tab[(ulong)(prVar11->le_bits).repr >> 0x30];
    LOCK();
    plVar1 = (long *)((long)pvVar4 + 0x48);
    *plVar1 = (long)((long)&paVar9->nthreads[0].repr + *plVar1);
    UNLOCK();
    tcache_02 = key;
  }
  key = paVar9;
  if (tcache_02 != (arena_t *)0x0) {
    tsd_00 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow;
    tcache_00 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
    tcache_init((tsd_t *)tsd_00,(tcache_slow_t *)tcache_00,(tcache_t *)tcache_02,
                duckdb_je_tcache_bin_info,(cache_bin_info_t *)in_R8);
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena = (arena_t *)0x0;
    if (duckdb_je_malloc_init_state == malloc_init_initialized) {
      if (arena == (arena_t *)0x0) {
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
          key = (arena_t *)&duckdb_je_malloc_init_state;
          arena = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
          if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena == (arena_t *)0x0)
             && (arena = duckdb_je_arena_choose_hard(tsd,false), key = arena,
                tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true))
          {
            key = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena;
            if (key != (arena_t *)0x0) {
              if (key == arena) goto LAB_01183dda;
              tcache_arena_dissociate((tsdn_t *)tsd,tsd_00,tcache_01);
            }
            duckdb_je_tcache_arena_associate((tsdn_t *)tsd,tsd_00,tcache_00,arena);
            key = extraout_RAX_00;
          }
        }
        else {
          key = (arena_t *)duckdb_je_arenas;
          arena = (arena_t *)duckdb_je_arenas[0];
          if (duckdb_je_arenas[0].repr == (void *)0x0) {
            key = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
            arena = key;
          }
        }
        if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena !=
            (arena_t *)0x0) goto LAB_01183dda;
      }
    }
    else {
      arena = (arena_t *)duckdb_je_arenas[0];
      if (duckdb_je_arenas[0].repr == (void *)0x0) {
        arena = (arena_t *)0x0;
      }
    }
    duckdb_je_tcache_arena_associate((tsdn_t *)tsd,tsd_00,tcache_00,arena);
    key = extraout_RAX;
  }
LAB_01183dda:
  return SUB81(key,0);
}

Assistant:

static bool
tsd_tcache_data_init(tsd_t *tsd, arena_t *arena,
    const cache_bin_info_t tcache_bin_info[TCACHE_NBINS_MAX]) {
	assert(tcache_bin_info != NULL);
	return tsd_tcache_data_init_impl(tsd, arena, tcache_bin_info);
}